

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp2.c
# Opt level: O0

ReturnCode control(Global *global,int *counter)

{
  int iVar1;
  int iVar2;
  ReturnCode RVar3;
  int iVar4;
  ushort **ppuVar5;
  int *in_RSI;
  Global *in_RDI;
  bool bVar6;
  int result;
  ReturnCode ret;
  char *ep;
  int hash;
  char *tp;
  int c;
  int *in_stack_00000360;
  Global *in_stack_00000368;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffffad;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int iVar8;
  int in_stack_ffffffffffffffc0;
  Global *in_stack_ffffffffffffffc8;
  int local_2c;
  char *pcVar9;
  int local_1c;
  
  iVar1 = skipws((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if ((iVar1 == 10) || (iVar1 == 0)) {
    *in_RSI = *in_RSI + 1;
    return FPP_OK;
  }
  ppuVar5 = __ctype_b_loc();
  if (((*ppuVar5)[iVar1] & 0x800) == 0) {
    scanid((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
           CONCAT13(in_stack_ffffffffffffffaf,
                    CONCAT12(in_stack_ffffffffffffffae,
                             CONCAT11(in_stack_ffffffffffffffad,in_stack_ffffffffffffffac))));
  }
  else {
    unget((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    strcpy(in_RDI->tokenbuf,"line");
  }
  if (in_RDI->tokenbuf[1] == '\0') {
    iVar1 = 0;
  }
  else {
    iVar1 = (int)*in_RDI->tokenbuf + in_RDI->tokenbuf[2] * 2;
  }
  local_2c = iVar1;
  if (iVar1 == 0) {
LAB_001039d1:
    pcVar9 = "";
  }
  else if (iVar1 == 0x69) {
    pcVar9 = "if";
  }
  else if (iVar1 == 0x12d) {
    pcVar9 = "endif";
  }
  else if (iVar1 == 0x12f) {
    pcVar9 = "include";
  }
  else if (iVar1 == 0x130) {
    pcVar9 = "define";
  }
  else if (iVar1 == 0x131) {
    pcVar9 = "ifdef";
  }
  else if (iVar1 == 0x132) {
    pcVar9 = "pragma";
  }
  else if (iVar1 == 0x137) {
    pcVar9 = "elif";
  }
  else if (iVar1 == 0x13d) {
    pcVar9 = "undef";
  }
  else if (iVar1 == 0x145) {
    pcVar9 = "ifndef";
  }
  else if (iVar1 == 0x147) {
    pcVar9 = "assert";
  }
  else if (iVar1 == 0x148) {
    pcVar9 = "line";
  }
  else if (iVar1 == 0x149) {
    pcVar9 = "error";
  }
  else {
    if (iVar1 != 0x14b) {
      local_2c = 0;
      goto LAB_001039d1;
    }
    pcVar9 = "else";
  }
  iVar8 = iVar1;
  iVar2 = strcmp(pcVar9,in_RDI->tokenbuf);
  if (iVar2 != 0) {
    local_2c = 0;
  }
  if (in_RDI->infile->fp == (FILE *)0x0) {
    cerror(in_RDI,WARN_CONTROL_LINE_IN_MACRO,in_RDI->tokenbuf);
  }
  if (in_RDI->ifstack[0] == '\0') {
    if (local_2c != 0x69) {
      if (local_2c - 0x12fU < 2) goto LAB_00103b0a;
      if (local_2c != 0x131) {
        if ((local_2c == 0x132) || (local_2c == 0x13d)) goto LAB_00103b0a;
        if (local_2c != 0x145) {
          in_stack_ffffffffffffffb4 = local_2c;
          if (local_2c - 0x147U < 3) goto LAB_00103b0a;
          goto LAB_00103b28;
        }
      }
    }
    pcVar9 = in_RDI->ifptr;
    in_RDI->ifptr = pcVar9 + 1;
    if (&in_RDI->field_0x275 <= pcVar9 + 1) {
      cerror(in_RDI,FATAL_TOO_MANY_NESTINGS,in_RDI->tokenbuf);
      return FPP_TOO_MANY_NESTED_STATEMENTS;
    }
    *in_RDI->ifptr = '\0';
LAB_00103b0a:
    dump_line((Global *)CONCAT44(local_2c,in_stack_ffffffffffffffb0),
              (int *)CONCAT17(in_stack_ffffffffffffffaf,
                              CONCAT16(in_stack_ffffffffffffffae,
                                       CONCAT15(in_stack_ffffffffffffffad,
                                                CONCAT14(in_stack_ffffffffffffffac,
                                                         in_stack_ffffffffffffffa8)))));
    return FPP_OK;
  }
LAB_00103b28:
  if ((0 < *in_RSI) && ((local_2c == 0x148 || (local_2c == 0x132)))) {
    Putchar((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
            CONCAT13(in_stack_ffffffffffffffaf,
                     CONCAT12(in_stack_ffffffffffffffae,
                              CONCAT11(in_stack_ffffffffffffffad,in_stack_ffffffffffffffac))));
    *in_RSI = *in_RSI + -1;
  }
  iVar2 = local_2c;
  if (local_2c == 0x69) goto LAB_001040a4;
  if (local_2c == 0x12d) {
    if (in_RDI->ifptr == in_RDI->ifstack) {
      cerror(in_RDI,ERROR_STRING_MUST_BE_IF,in_RDI->tokenbuf);
      dump_line((Global *)CONCAT44(in_stack_ffffffffffffffb4,local_2c),
                (int *)CONCAT17(in_stack_ffffffffffffffaf,
                                CONCAT16(in_stack_ffffffffffffffae,
                                         CONCAT15(in_stack_ffffffffffffffad,
                                                  CONCAT14(in_stack_ffffffffffffffac,
                                                           in_stack_ffffffffffffffa8)))));
      return FPP_OK;
    }
    if ((in_RDI->ifstack[0] == '\0') && ((*in_RDI->ifptr & 1U) != 0)) {
      in_RDI->wrongline = 1;
    }
    in_RDI->ifstack[0] = (*in_RDI->ifptr & 1U) != 0;
    in_RDI->ifptr = in_RDI->ifptr + -1;
    goto LAB_0010435f;
  }
  if (local_2c == 0x12f) {
    RVar3 = doinclude((Global *)CONCAT44(iVar8,iVar1));
  }
  else if (local_2c == 0x130) {
    RVar3 = dodefine((Global *)pcVar9);
  }
  else {
    if (local_2c != 0x131) {
      if (local_2c == 0x132) {
        Putstring((Global *)CONCAT44(in_stack_ffffffffffffffb4,0x132),
                  (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                   CONCAT16(in_stack_ffffffffffffffae,
                                            CONCAT15(in_stack_ffffffffffffffad,
                                                     CONCAT14(in_stack_ffffffffffffffac,
                                                              in_stack_ffffffffffffffa8)))));
        while( true ) {
          iVar1 = get(in_stack_ffffffffffffffc8);
          uVar7 = iVar1 != 10 && iVar1 != 0;
          if (iVar1 == 10 || iVar1 == 0) break;
          Putchar((Global *)CONCAT44(in_stack_ffffffffffffffb4,iVar2),
                  CONCAT13(in_stack_ffffffffffffffaf,
                           CONCAT12(in_stack_ffffffffffffffae,
                                    CONCAT11(uVar7,in_stack_ffffffffffffffac))));
        }
        unget((Global *)CONCAT44(in_stack_ffffffffffffffb4,iVar2));
        Putchar((Global *)CONCAT44(in_stack_ffffffffffffffb4,iVar2),
                CONCAT13(in_stack_ffffffffffffffaf,
                         CONCAT12(in_stack_ffffffffffffffae,
                                  CONCAT11(uVar7,in_stack_ffffffffffffffac))));
        goto LAB_0010435f;
      }
      if (local_2c == 0x137) {
        if (in_RDI->ifptr == in_RDI->ifstack) {
          cerror(in_RDI,ERROR_STRING_MUST_BE_IF,in_RDI->tokenbuf);
          dump_line((Global *)CONCAT44(in_stack_ffffffffffffffb4,local_2c),
                    (int *)CONCAT17(in_stack_ffffffffffffffaf,
                                    CONCAT16(in_stack_ffffffffffffffae,
                                             CONCAT15(in_stack_ffffffffffffffad,
                                                      CONCAT14(in_stack_ffffffffffffffac,
                                                               in_stack_ffffffffffffffa8)))));
          return FPP_OK;
        }
        if ((*in_RDI->ifptr & 2U) != 0) {
          cerror(in_RDI,ERROR_STRING_MAY_NOT_FOLLOW_ELSE,in_RDI->tokenbuf);
          dump_line((Global *)CONCAT44(in_stack_ffffffffffffffb4,local_2c),
                    (int *)CONCAT17(in_stack_ffffffffffffffaf,
                                    CONCAT16(in_stack_ffffffffffffffae,
                                             CONCAT15(in_stack_ffffffffffffffad,
                                                      CONCAT14(in_stack_ffffffffffffffac,
                                                               in_stack_ffffffffffffffa8)))));
          return FPP_OK;
        }
        if ((*in_RDI->ifptr & 5U) != 1) {
          in_RDI->ifstack[0] = '\0';
          dump_line((Global *)CONCAT44(in_stack_ffffffffffffffb4,0x137),
                    (int *)CONCAT17(in_stack_ffffffffffffffaf,
                                    CONCAT16(in_stack_ffffffffffffffae,
                                             CONCAT15(in_stack_ffffffffffffffad,
                                                      CONCAT14(in_stack_ffffffffffffffac,
                                                               in_stack_ffffffffffffffa8)))));
          return FPP_OK;
        }
        RVar3 = doif((Global *)CONCAT44(iVar8,iVar1),in_stack_ffffffffffffffb4);
        goto joined_r0x00103e27;
      }
      if (local_2c == 0x13d) {
        doundef((Global *)CONCAT44(in_stack_ffffffffffffffb4,0x13d));
        goto LAB_0010435f;
      }
      if (local_2c != 0x145) {
        if (local_2c == 0x147) {
          RVar3 = eval(in_stack_00000368,in_stack_00000360);
          if (RVar3 != FPP_OK) {
            return RVar3;
          }
          if (in_stack_ffffffffffffffc0 == 0) {
            cerror(in_RDI,ERROR_PREPROC_FAILURE);
          }
        }
        else if (local_2c == 0x148) {
          local_1c = skipws((Global *)CONCAT44(in_stack_ffffffffffffffb4,0x148));
          in_RDI->workp = in_RDI->work;
          while (uVar7 = local_1c != 10 && local_1c != 0, (bool)uVar7) {
            RVar3 = save((Global *)
                         CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffffae,
                                                 CONCAT15(in_stack_ffffffffffffffad,
                                                          CONCAT14(in_stack_ffffffffffffffac,
                                                                   in_stack_ffffffffffffffa8)))),0);
            if (RVar3 != FPP_OK) {
              return RVar3;
            }
            local_1c = get(in_stack_ffffffffffffffc8);
          }
          unget((Global *)CONCAT44(in_stack_ffffffffffffffb4,iVar2));
          RVar3 = save((Global *)
                       CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffffae,
                                               CONCAT15(in_stack_ffffffffffffffad,
                                                        CONCAT14(in_stack_ffffffffffffffac,
                                                                 in_stack_ffffffffffffffa8)))),0);
          if (RVar3 != FPP_OK) {
            return RVar3;
          }
          iVar4 = atoi(in_RDI->work);
          in_RDI->line = iVar4 + -1;
          pcVar9 = in_RDI->work;
          while( true ) {
            ppuVar5 = __ctype_b_loc();
            bVar6 = true;
            if (((*ppuVar5)[(int)*pcVar9] & 0x800) == 0) {
              bVar6 = type[(byte)*pcVar9] == 'C';
            }
            if (!bVar6) break;
            pcVar9 = pcVar9 + 1;
          }
          if (*pcVar9 != 0) {
            if ((*pcVar9 == 0x22) && (pcVar9 = strrchr(pcVar9 + 1,0x22), pcVar9 != (char *)0x0)) {
              *pcVar9 = '\0';
            }
            if (in_RDI->infile->progname != (char *)0x0) {
              Freemem((void *)0x103de4);
            }
            pcVar9 = savestring((Global *)CONCAT44(RVar3,in_stack_ffffffffffffffc0),
                                (char *)CONCAT44(iVar8,iVar1));
            in_RDI->infile->progname = pcVar9;
          }
          in_RDI->wrongline = 1;
        }
        else if (local_2c == 0x149) {
          cerror(in_RDI,ERROR_ERROR);
        }
        else if (local_2c == 0x14b) {
          if (in_RDI->ifptr == in_RDI->ifstack) {
            cerror(in_RDI,ERROR_STRING_MUST_BE_IF,in_RDI->tokenbuf);
            dump_line((Global *)CONCAT44(in_stack_ffffffffffffffb4,local_2c),
                      (int *)CONCAT17(in_stack_ffffffffffffffaf,
                                      CONCAT16(in_stack_ffffffffffffffae,
                                               CONCAT15(in_stack_ffffffffffffffad,
                                                        CONCAT14(in_stack_ffffffffffffffac,
                                                                 in_stack_ffffffffffffffa8)))));
            return FPP_OK;
          }
          if ((*in_RDI->ifptr & 2U) != 0) {
            cerror(in_RDI,ERROR_STRING_MAY_NOT_FOLLOW_ELSE,in_RDI->tokenbuf);
            dump_line((Global *)CONCAT44(in_stack_ffffffffffffffb4,local_2c),
                      (int *)CONCAT17(in_stack_ffffffffffffffaf,
                                      CONCAT16(in_stack_ffffffffffffffae,
                                               CONCAT15(in_stack_ffffffffffffffad,
                                                        CONCAT14(in_stack_ffffffffffffffac,
                                                                 in_stack_ffffffffffffffa8)))));
            return FPP_OK;
          }
          *in_RDI->ifptr = *in_RDI->ifptr | 2;
          if ((*in_RDI->ifptr & 1U) != 0) {
            if ((in_RDI->ifstack[0] == '\0') && ((*in_RDI->ifptr & 4U) == 0)) {
              in_RDI->ifstack[0] = '\x01';
            }
            else {
              in_RDI->ifstack[0] = '\0';
            }
          }
        }
        else {
          if (in_RDI->warnillegalcpp != '\0') {
            cerror(in_RDI,WARN_ILLEGAL_COMMAND,in_RDI->tokenbuf);
          }
          Putchar((Global *)CONCAT44(in_stack_ffffffffffffffb4,iVar2),
                  CONCAT13(in_stack_ffffffffffffffaf,
                           CONCAT12(in_stack_ffffffffffffffae,
                                    CONCAT11(in_stack_ffffffffffffffad,in_stack_ffffffffffffffac))))
          ;
          Putstring((Global *)CONCAT44(in_stack_ffffffffffffffb4,iVar2),
                    (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                     CONCAT16(in_stack_ffffffffffffffae,
                                              CONCAT15(in_stack_ffffffffffffffad,
                                                       CONCAT14(in_stack_ffffffffffffffac,
                                                                in_stack_ffffffffffffffa8)))));
          Putchar((Global *)CONCAT44(in_stack_ffffffffffffffb4,iVar2),
                  CONCAT13(in_stack_ffffffffffffffaf,
                           CONCAT12(in_stack_ffffffffffffffae,
                                    CONCAT11(in_stack_ffffffffffffffad,in_stack_ffffffffffffffac))))
          ;
          while( true ) {
            iVar1 = get(in_stack_ffffffffffffffc8);
            uVar7 = iVar1 != 10 && iVar1 != 0;
            if (iVar1 == 10 || iVar1 == 0) break;
            Putchar((Global *)CONCAT44(in_stack_ffffffffffffffb4,iVar2),
                    CONCAT13(in_stack_ffffffffffffffaf,
                             CONCAT12(in_stack_ffffffffffffffae,
                                      CONCAT11(in_stack_ffffffffffffffad,uVar7))));
          }
          unget((Global *)CONCAT44(in_stack_ffffffffffffffb4,iVar2));
          Putchar((Global *)CONCAT44(in_stack_ffffffffffffffb4,iVar2),
                  CONCAT13(in_stack_ffffffffffffffaf,
                           CONCAT12(in_stack_ffffffffffffffae,
                                    CONCAT11(in_stack_ffffffffffffffad,uVar7))));
        }
        goto LAB_0010435f;
      }
    }
LAB_001040a4:
    pcVar9 = in_RDI->ifptr;
    in_RDI->ifptr = pcVar9 + 1;
    if (&in_RDI->field_0x275 <= pcVar9 + 1) {
      cerror(in_RDI,FATAL_TOO_MANY_NESTINGS,in_RDI->tokenbuf);
      return FPP_TOO_MANY_NESTED_STATEMENTS;
    }
    *in_RDI->ifptr = '\x01';
    RVar3 = doif((Global *)CONCAT44(iVar8,iVar1),in_stack_ffffffffffffffb4);
  }
joined_r0x00103e27:
  if (RVar3 != FPP_OK) {
    return RVar3;
  }
LAB_0010435f:
  if ((local_2c != 0x12f) &&
     (iVar1 = skipws((Global *)CONCAT44(in_stack_ffffffffffffffb4,iVar2)), iVar1 != 10)) {
    cerror(in_RDI,WARN_UNEXPECTED_TEXT_IGNORED);
    skipnl((Global *)CONCAT44(in_stack_ffffffffffffffb4,iVar2));
  }
  *in_RSI = *in_RSI + 1;
  return FPP_OK;
}

Assistant:

ReturnCode control( struct Global *global,
    int *counter )  /* Pending newline counter */
{
    /*
     * Process #control lines.  Simple commands are processed inline,
     * while complex commands have their own subroutines.
     *
     * The counter is used to force out a newline before #line, and
     * #pragma commands.  This prevents these commands from ending up at
     * the end of the previous line if cpp is invoked with the -C option.
     */

    int c;
    char *tp;
    int hash;
    char *ep;
    ReturnCode ret;

    c = skipws( global );

    if( c == '\n' || c == EOF_CHAR )
        {
        (*counter)++;

        return(FPP_OK);
        }

    if( !isdigit(c) )
        scanid( global, c );                  /* Get #word to tokenbuf        */
    else
        {
        unget( global );                    /* Hack -- allow #123 as a      */

        strcpy( global->tokenbuf, "line" );   /* synonym for #line 123        */
        }

    hash = (global->tokenbuf[1] == EOS) ? L_nogood : (global->tokenbuf[0] + (global->tokenbuf[2] << 1));

    switch( hash )
        {
        case L_assert:
            tp = "assert";
            break;
        case L_define:
            tp = "define";
            break;
        case L_elif:
            tp = "elif";
            break;
        case L_else:
            tp = "else";
            break;
        case L_endif:
            tp = "endif";
            break;
        case L_error:
            tp = "error";
            break;
        case L_if:
            tp = "if";
            break;
        case L_ifdef:
            tp = "ifdef";
            break;
        case L_ifndef:
            tp = "ifndef";
            break;
        case L_include:
            tp = "include";
            break;
        case L_line:
            tp = "line";
            break;
        case L_pragma:
            tp = "pragma";
            break;
        case L_undef:
            tp = "undef";
            break;
        default:
            hash = L_nogood;
        case L_nogood:
            tp = "";
            break;
        }

    if( !streq( tp, global->tokenbuf ) )
        hash = L_nogood;

    /*
     * hash is set to a unique value corresponding to the
     * control keyword (or L_nogood if we think it's nonsense).
     */
    if( global->infile->fp == NULL )
        cwarn( global, WARN_CONTROL_LINE_IN_MACRO, global->tokenbuf );

    if( !compiling )
        {                       /* Not compiling now    */
        switch( hash )
            {
            case L_if:              /* These can't turn     */
            case L_ifdef:           /*  compilation on, but */
            case L_ifndef:          /*   we must nest #if's */
                if( ++global->ifptr >= &global->ifstack[BLK_NEST] )
                    {
                    cfatal( global, FATAL_TOO_MANY_NESTINGS, global->tokenbuf );

                    return( FPP_TOO_MANY_NESTED_STATEMENTS );
                    }

                *global->ifptr = 0;       /* !WAS_COMPILING   */

            case L_line:            /* Many         */
                /*
                 * Are pragma's always processed?
                 */
            case L_pragma:          /*  options     */
            case L_include:         /*   are uninteresting  */
            case L_define:          /*    if we     */
            case L_undef:           /*     aren't           */
            case L_assert:          /*  compiling.  */
            case L_error:
                dump_line( global, counter );       /* Ignore rest of line  */
                return(FPP_OK);
            }
        }
    /*
     * Make sure that #line and #pragma are output on a fresh line.
     */
    if( *counter > 0 && (hash == L_line || hash == L_pragma) )
        {
        Putchar( global, '\n' );

        (*counter)--;
        }

    switch( hash )
        {
        case L_line:
            /*
             * Parse the line to update the line number and "progname"
             * field and line number for the next input line.
             * Set wrongline to force it out later.
             */
            c = skipws( global );

            global->workp = global->work;       /* Save name in work    */

            while( c != '\n' && c != EOF_CHAR )
                {
                if( (ret = save( global, c )) )
                    return(ret);

                c = get( global );
                }

            unget( global );

            if( (ret = save( global, EOS )) )
                return(ret);

            /*
             * Split #line argument into <line-number> and <name>
             * We subtract 1 as we want the number of the next line.
             */
            global->line = atoi(global->work) - 1;     /* Reset line number    */

            for( tp = global->work; isdigit(*tp) || type[(uint8_t)*tp] == SPA; tp++)
                ;             /* Skip over digits */

            if( *tp != EOS )
                {
                /* Got a filename, so:  */

                if( *tp == '"' && (ep = strrchr(tp + 1, '"')) != NULL )
                    {
                    tp++;           /* Skip over left quote */

                    *ep = EOS;      /* And ignore right one */
                    }

                if( global->infile->progname != NULL )
                    /* Give up the old name if it's allocated.   */
                    Freemem( global->infile->progname );

                global->infile->progname = savestring( global, tp );
                }

            global->wrongline = TRUE;           /* Force output later   */
            break;

        case L_include:
            ret = doinclude( global );
            if( ret )
                return(ret);
            break;

        case L_define:
            ret = dodefine( global );
            if( ret )
                return(ret);
            break;

        case L_undef:
            doundef( global );
            break;

        case L_else:
            if( global->ifptr == &global->ifstack[0] )
                {
                cerror( global, ERROR_STRING_MUST_BE_IF, global->tokenbuf );

                dump_line( global, counter );

                return( FPP_OK );
                }
            else if( (*global->ifptr & ELSE_SEEN) != 0 )
                {
                cerror( global, ERROR_STRING_MAY_NOT_FOLLOW_ELSE, global->tokenbuf );

                dump_line( global, counter );

                return( FPP_OK );
                }

            *global->ifptr |= ELSE_SEEN;

            if( (*global->ifptr & WAS_COMPILING) != 0 )
                {
                if( compiling || (*global->ifptr & TRUE_SEEN) != 0 )
                    compiling = FALSE;
                else
                    {
                    compiling = TRUE;
                    }
                }
            break;

        case L_elif:
            if( global->ifptr == &global->ifstack[0] )
                {
                cerror( global, ERROR_STRING_MUST_BE_IF, global->tokenbuf );

                dump_line( global, counter );

                return( FPP_OK );
                }
            else if( (*global->ifptr & ELSE_SEEN) != 0 )
                {
                cerror( global, ERROR_STRING_MAY_NOT_FOLLOW_ELSE, global->tokenbuf );

                dump_line( global, counter );

                return( FPP_OK );
                }

            if( (*global->ifptr & (WAS_COMPILING | TRUE_SEEN)) != WAS_COMPILING )
                {
                compiling = FALSE;        /* Done compiling stuff */

                dump_line( global, counter );   /* Skip this clause */

                return( FPP_OK );
                }

            ret = doif( global, L_if );

            if( ret )
                return(ret);

            break;

        case L_error:
            cerror(global, ERROR_ERROR);
            break;

        case L_if:
        case L_ifdef:
        case L_ifndef:
            if( ++global->ifptr < &global->ifstack[BLK_NEST] )
                {
                *global->ifptr = WAS_COMPILING;

                ret = doif( global, hash );

                if( ret )
                    return(ret);

                break;
                }

            cfatal( global, FATAL_TOO_MANY_NESTINGS, global->tokenbuf );

            return( FPP_TOO_MANY_NESTED_STATEMENTS );

        case L_endif:
            if( global->ifptr == &global->ifstack[0] )
                {
                cerror( global, ERROR_STRING_MUST_BE_IF, global->tokenbuf );

                dump_line( global, counter );

                return(FPP_OK);
                }

            if( !compiling && (*global->ifptr & WAS_COMPILING) != 0 )
                global->wrongline = TRUE;

            compiling = ((*global->ifptr & WAS_COMPILING) != 0);

            --global->ifptr;

            break;

        case L_assert:
            {
            int result;

            ret = eval( global, &result );

            if(ret)
                return(ret);

            if( result == 0 )
                cerror( global, ERROR_PREPROC_FAILURE );
            }
            break;

        case L_pragma:
            /*
             * #pragma is provided to pass "options" to later
             * passes of the compiler.  cpp doesn't have any yet.
             */
            Putstring( global, "#pragma " );

            while( (c = get( global ) ) != '\n' && c != EOF_CHAR )
                Putchar( global, c );

            unget( global );

            Putchar( global, '\n' );

            break;

        default:
            /*
             * Undefined #control keyword.
             * Note: the correct behavior may be to warn and
             * pass the line to a subsequent compiler pass.
             * This would allow #asm or similar extensions.
             */
            if( global->warnillegalcpp )
                cwarn( global, WARN_ILLEGAL_COMMAND, global->tokenbuf );

            Putchar( global, '#' );
            Putstring( global, global->tokenbuf );
            Putchar( global, ' ' );

            while( (c = get( global ) ) != '\n' && c != EOF_CHAR )
                Putchar( global, c );

            unget( global );

            Putchar( global, '\n' );

            break;
        }

    if( hash != L_include )
        {
        #if OLD_PREPROCESSOR
        /*
         * Ignore the rest of the #control line so you can write
         *      #if foo
         *      #endif  foo
         */
        dump_line( global, counter );         /* Take common exit */

        return( FPP_OK );
        #else
        if( skipws( global ) != '\n' )
            {
            cwarn( global, WARN_UNEXPECTED_TEXT_IGNORED );

            skipnl( global );
            }
        #endif
        }

    (*counter)++;

    return( FPP_OK );
}